

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bbdpre.c
# Opt level: O1

int ARKBBDPrecInit(void *arkode_mem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                  sunindextype mukeep,sunindextype mlkeep,sunrealtype dqrely,ARKLocalFn gloc,
                  ARKCommFn cfn)

{
  N_Vector *v;
  N_Vector *v_00;
  N_Vector *v_01;
  double __x;
  int iVar1;
  long *__ptr;
  SUNMatrix p_Var2;
  N_Vector p_Var3;
  SUNLinearSolver p_Var4;
  long lVar5;
  long ml;
  long smu;
  sunrealtype sVar6;
  long liw;
  long lrw;
  ARKLsMem arkls_mem;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeMem local_80;
  void *local_78;
  ARKodeMem local_70;
  long local_68;
  long local_60;
  ARKLsMem local_58;
  long local_50;
  sunrealtype local_48;
  long local_40;
  long local_38;
  
  local_48 = dqrely;
  iVar1 = arkLs_AccessARKODELMem(arkode_mem,"ARKBBDPrecInit",&local_80,&local_58);
  if (iVar1 == 0) {
    local_50 = mldq;
    if (local_80->tempv1->ops->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0) {
      arkProcessError(local_80,-3,0x46,"ARKBBDPrecInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                      ,"A required vector operation is not implemented.");
      iVar1 = -3;
    }
    else {
      local_70 = local_80;
      local_78 = arkode_mem;
      __ptr = (long *)malloc(0xa0);
      if (__ptr == (long *)0x0) {
        iVar1 = 0x50;
        local_80 = local_70;
      }
      else {
        ml = 0;
        if (mudq < 1) {
          mudq = ml;
        }
        smu = Nlocal + -1;
        if (Nlocal <= mudq) {
          mudq = smu;
        }
        lVar5 = local_50;
        if (local_50 < 1) {
          lVar5 = ml;
        }
        __ptr[0x13] = (long)local_78;
        if (Nlocal <= lVar5) {
          lVar5 = smu;
        }
        __ptr[5] = (long)gloc;
        if (mukeep < 1) {
          mukeep = ml;
        }
        if (Nlocal <= mukeep) {
          mukeep = smu;
        }
        __ptr[6] = (long)cfn;
        if (0 < mlkeep) {
          ml = mlkeep;
        }
        *__ptr = mudq;
        if (Nlocal <= ml) {
          ml = smu;
        }
        __ptr[1] = lVar5;
        __ptr[2] = mukeep;
        __ptr[3] = ml;
        p_Var2 = SUNBandMatrixStorage(Nlocal,mukeep,ml,mukeep,local_70->sunctx);
        __ptr[7] = (long)p_Var2;
        if (p_Var2 == (SUNMatrix)0x0) {
          free(__ptr);
          iVar1 = 0x66;
        }
        else {
          if (ml + mukeep < Nlocal) {
            smu = ml + mukeep;
          }
          __ptr[8] = 0;
          p_Var2 = SUNBandMatrixStorage(Nlocal,mukeep,ml,smu,local_80->sunctx);
          __ptr[8] = (long)p_Var2;
          if (p_Var2 == (SUNMatrix)0x0) {
            SUNMatDestroy(__ptr[7]);
            free(__ptr);
            iVar1 = 0x75;
          }
          else {
            __ptr[0xd] = 0;
            p_Var3 = N_VNewEmpty_Serial(Nlocal,local_80->sunctx);
            __ptr[0xd] = (long)p_Var3;
            if (p_Var3 == (N_Vector)0x0) {
              SUNMatDestroy(__ptr[8]);
              SUNMatDestroy(__ptr[7]);
              free(__ptr);
              iVar1 = 0x84;
            }
            else {
              __ptr[0xe] = 0;
              p_Var3 = N_VNewEmpty_Serial(Nlocal,local_80->sunctx);
              __ptr[0xe] = (long)p_Var3;
              if (p_Var3 == (N_Vector)0x0) {
                N_VDestroy(__ptr[0xd]);
                SUNMatDestroy(__ptr[8]);
                SUNMatDestroy(__ptr[7]);
                free(__ptr);
                iVar1 = 0x92;
              }
              else {
                v = (N_Vector *)(__ptr + 10);
                __ptr[10] = 0;
                iVar1 = arkAllocVec(local_80,local_80->tempv1,v);
                if (iVar1 == 0) {
                  N_VDestroy(__ptr[0xd]);
                  N_VDestroy(__ptr[0xe]);
                  SUNMatDestroy(__ptr[8]);
                  SUNMatDestroy(__ptr[7]);
                  free(__ptr);
                  iVar1 = 0xa0;
                }
                else {
                  v_00 = (N_Vector *)(__ptr + 0xb);
                  __ptr[0xb] = 0;
                  iVar1 = arkAllocVec(local_80,local_80->tempv1,v_00);
                  if (iVar1 == 0) {
                    arkFreeVec(local_80,v);
                    N_VDestroy(__ptr[0xd]);
                    N_VDestroy(__ptr[0xe]);
                    SUNMatDestroy(__ptr[8]);
                    SUNMatDestroy(__ptr[7]);
                    free(__ptr);
                    iVar1 = 0xaf;
                  }
                  else {
                    v_01 = (N_Vector *)(__ptr + 0xc);
                    __ptr[0xc] = 0;
                    iVar1 = arkAllocVec(local_80,local_80->tempv1,v_01);
                    if (iVar1 == 0) {
                      arkFreeVec(local_80,v);
                      arkFreeVec(local_80,v_00);
                      N_VDestroy(__ptr[0xd]);
                      N_VDestroy(__ptr[0xe]);
                      SUNMatDestroy(__ptr[8]);
                      SUNMatDestroy(__ptr[7]);
                      free(__ptr);
                      iVar1 = 0xbf;
                    }
                    else {
                      __ptr[9] = 0;
                      p_Var4 = SUNLinSol_Band((N_Vector)__ptr[0xe],(SUNMatrix)__ptr[8],
                                              local_80->sunctx);
                      __ptr[9] = (long)p_Var4;
                      if (p_Var4 != (SUNLinearSolver)0x0) {
                        SUNLinSolInitialize(p_Var4);
                        if (__ptr[9] != 0) {
                          sVar6 = local_48;
                          if (local_48 <= 0.0) {
                            __x = local_80->uround;
                            sVar6 = 0.0;
                            if (0.0 < __x) {
                              if (__x < 0.0) {
                                sVar6 = sqrt(__x);
                              }
                              else {
                                sVar6 = SQRT(__x);
                              }
                            }
                          }
                          __ptr[4] = (long)sVar6;
                          __ptr[0xf] = Nlocal;
                          __ptr[0x10] = 0;
                          __ptr[0x11] = 0;
                          if (local_80->tempv1->ops->nvspace !=
                              (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
                            N_VSpace(local_80->tempv1,&local_38,&local_40);
                            __ptr[0x10] = __ptr[0x10] + local_38 * 3;
                            __ptr[0x11] = __ptr[0x11] + local_40 * 3;
                          }
                          if (*(long *)(*(long *)(__ptr[0xe] + 8) + 0x20) != 0) {
                            N_VSpace(__ptr[0xe],&local_38,&local_40);
                            __ptr[0x10] = __ptr[0x10] + local_38 * 2;
                            __ptr[0x11] = __ptr[0x11] + local_40 * 2;
                          }
                          if (*(long *)(*(long *)(__ptr[7] + 8) + 0x48) != 0) {
                            SUNMatSpace(__ptr[7],&local_60,&local_68);
                            __ptr[0x10] = __ptr[0x10] + local_60;
                            __ptr[0x11] = __ptr[0x11] + local_68;
                          }
                          if (*(long *)(*(long *)(__ptr[8] + 8) + 0x48) != 0) {
                            SUNMatSpace(__ptr[8],&local_60,&local_68);
                            __ptr[0x10] = __ptr[0x10] + local_60;
                            __ptr[0x11] = __ptr[0x11] + local_68;
                          }
                          if (*(long *)(*(long *)(__ptr[9] + 8) + 0x60) != 0) {
                            SUNLinSolSpace(__ptr[9],&local_60,&local_68);
                            __ptr[0x10] = __ptr[0x10] + local_60;
                            __ptr[0x11] = __ptr[0x11] + local_68;
                          }
                          __ptr[0x12] = 0;
                          if (local_58->pfree != (_func_int_ARKodeMem *)0x0) {
                            (*local_58->pfree)(local_80);
                          }
                          local_58->P_data = __ptr;
                          local_58->pfree = ARKBBDPrecFree;
                          iVar1 = ARKodeSetPreconditioner(local_78,ARKBBDPrecSetup,ARKBBDPrecSolve);
                          return iVar1;
                        }
                        arkFreeVec(local_80,v);
                        arkFreeVec(local_80,v_00);
                        arkFreeVec(local_80,v_01);
                        N_VDestroy(__ptr[0xd]);
                        N_VDestroy(__ptr[0xe]);
                        SUNMatDestroy(__ptr[8]);
                        SUNMatDestroy(__ptr[7]);
                        SUNLinSolFree(__ptr[9]);
                        free(__ptr);
                        arkProcessError(local_80,-0xc,0xe5,"ARKBBDPrecInit",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                                        ,"An error arose from a SUNBandLinearSolver routine.");
                        return -0xc;
                      }
                      arkFreeVec(local_80,v);
                      arkFreeVec(local_80,v_00);
                      arkFreeVec(local_80,v_01);
                      N_VDestroy(__ptr[0xd]);
                      N_VDestroy(__ptr[0xe]);
                      SUNMatDestroy(__ptr[8]);
                      SUNMatDestroy(__ptr[7]);
                      free(__ptr);
                      iVar1 = 0xd2;
                    }
                  }
                }
              }
            }
          }
        }
      }
      arkProcessError(local_80,-4,iVar1,"ARKBBDPrecInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                      ,"A memory request failed.");
      iVar1 = -4;
    }
  }
  return iVar1;
}

Assistant:

int ARKBBDPrecInit(void* arkode_mem, sunindextype Nlocal, sunindextype mudq,
                   sunindextype mldq, sunindextype mukeep, sunindextype mlkeep,
                   sunrealtype dqrely, ARKLocalFn gloc, ARKCommFn cfn)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access ARKodeMem and ARKLsMem structure */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  if (ark_mem->tempv1->ops->nvgetarraypointer == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BBD_BAD_NVECTOR);
    return (ARKLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (ARKBBDPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Set pointers to gloc and cfn; load half-bandwidths */
  pdata->arkode_mem = arkode_mem;
  pdata->gloc       = gloc;
  pdata->cfn        = cfn;
  pdata->mudq       = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq       = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));
  muk               = SUNMIN(Nlocal - 1, SUNMAX(0, mukeep));
  mlk               = SUNMIN(Nlocal - 1, SUNMAX(0, mlkeep));
  pdata->mukeep     = muk;
  pdata->mlkeep     = mlk;

  /* Allocate memory for saved Jacobian */
  pdata->savedJ = SUNBandMatrixStorage(Nlocal, muk, mlk, muk, ark_mem->sunctx);
  if (pdata->savedJ == NULL)
  {
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for preconditioner matrix */
  storage_mu    = SUNMIN(Nlocal - 1, muk + mlk);
  pdata->savedP = NULL;
  pdata->savedP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu,
                                       ark_mem->sunctx);
  if (pdata->savedP == NULL)
  {
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */

  pdata->zlocal = NULL;
  pdata->zlocal = N_VNewEmpty_Serial(Nlocal, ark_mem->sunctx);
  if (pdata->zlocal == NULL)
  {
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal, ark_mem->sunctx);
  if (pdata->rlocal == NULL)
  {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->tmp1 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp1)))
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->tmp2 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp2)))
  {
    arkFreeVec(ark_mem, &(pdata->tmp1));
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->tmp3 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp3)))
  {
    arkFreeVec(ark_mem, &(pdata->tmp1));
    arkFreeVec(ark_mem, &(pdata->tmp2));
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->rlocal, pdata->savedP, ark_mem->sunctx);
  if (pdata->LS == NULL)
  {
    arkFreeVec(ark_mem, &(pdata->tmp1));
    arkFreeVec(ark_mem, &(pdata->tmp2));
    arkFreeVec(ark_mem, &(pdata->tmp3));
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  retval = SUNLinSolInitialize(pdata->LS);
  if (pdata->LS == NULL)
  {
    arkFreeVec(ark_mem, &(pdata->tmp1));
    arkFreeVec(ark_mem, &(pdata->tmp2));
    arkFreeVec(ark_mem, &(pdata->tmp3));
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    SUNLinSolFree(pdata->LS);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_SUNLS_FAIL);
    return (ARKLS_SUNLS_FAIL);
  }

  /* Set dqrely based on input dqrely (0 implies default). */
  pdata->dqrely = (dqrely > ZERO) ? dqrely : SUNRsqrt(ark_mem->uround);

  /* Store Nlocal to be used in ARKBBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (ark_mem->tempv1->ops->nvspace)
  {
    N_VSpace(ark_mem->tempv1, &lrw1, &liw1);
    pdata->rpwsize += 3 * lrw1;
    pdata->ipwsize += 3 * liw1;
  }
  if (pdata->rlocal->ops->nvspace)
  {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += 2 * lrw1;
    pdata->ipwsize += 2 * liw1;
  }
  if (pdata->savedJ->ops->space)
  {
    retval = SUNMatSpace(pdata->savedJ, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->savedP->ops->space)
  {
    retval = SUNMatSpace(pdata->savedP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space)
  {
    retval = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure P_data is free from any previous allocations */
  if (arkls_mem->pfree) { arkls_mem->pfree(ark_mem); }

  /* Point to the new P_data field in the LS memory */
  arkls_mem->P_data = pdata;

  /* Attach the pfree function */
  arkls_mem->pfree = ARKBBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  retval = ARKodeSetPreconditioner(arkode_mem, ARKBBDPrecSetup, ARKBBDPrecSolve);

  return (retval);
}